

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O3

void err_state_free(void *statep)

{
  undefined8 *puVar1;
  ERR_STATE *state;
  long lVar2;
  
  if (statep != (void *)0x0) {
    lVar2 = 8;
    do {
      free(*(void **)((long)statep + lVar2));
      puVar1 = (undefined8 *)((long)statep + lVar2 + -8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)statep + lVar2 + 8) = 0;
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0x188);
    free(*(void **)((long)statep + 0x188));
    free(statep);
    return;
  }
  return;
}

Assistant:

static void err_state_free(void *statep) {
  ERR_STATE *state = reinterpret_cast<ERR_STATE *>(statep);

  if (state == NULL) {
    return;
  }

  for (unsigned i = 0; i < ERR_NUM_ERRORS; i++) {
    err_clear(&state->errors[i]);
  }
  free(state->to_free);
  free(state);
}